

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t locale_canonKeywordName(char *buf,char *keywordName,UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  int local_2c;
  int32_t keywordNameLen;
  UErrorCode *status_local;
  char *keywordName_local;
  char *buf_local;
  
  local_2c = 0;
  status_local = (UErrorCode *)keywordName;
  while( true ) {
    if ((char)*status_local == U_ZERO_ERROR) {
      if (local_2c == 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        buf_local._4_4_ = 0;
      }
      else {
        buf[local_2c] = '\0';
        buf_local._4_4_ = local_2c;
      }
      return buf_local._4_4_;
    }
    UVar1 = uprv_isASCIILetter_63((char)*status_local);
    if ((UVar1 == '\0') && (((char)*status_local < '0' || ('9' < (char)*status_local)))) break;
    if (0x17 < local_2c) {
      *status = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    }
    cVar2 = uprv_asciitolower_63((char)*status_local);
    buf[local_2c] = cVar2;
    status_local = (UErrorCode *)((long)status_local + 1);
    local_2c = local_2c + 1;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

static int32_t locale_canonKeywordName(char *buf, const char *keywordName, UErrorCode *status)
{
  int32_t keywordNameLen = 0;

  for (; *keywordName != 0; keywordName++) {
    if (!UPRV_ISALPHANUM(*keywordName)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
      return 0;
    }
    if (keywordNameLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
      buf[keywordNameLen++] = uprv_tolower(*keywordName);
    } else {
      /* keyword name too long for internal buffer */
      *status = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    }
  }
  if (keywordNameLen == 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name */
    return 0;
  }
  buf[keywordNameLen] = 0; /* terminate */

  return keywordNameLen;
}